

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O0

Zp_field_element<2U,_unsigned_int,_void> __thiscall
Gudhi::persistence_fields::Zp_field_element<2U,_unsigned_int,_void>::get_inverse
          (Zp_field_element<2U,_unsigned_int,_void> *this)

{
  value_type vVar1;
  reference pvVar2;
  uint *in_RSI;
  Zp_field_element<2U,_unsigned_int,_void> *this_local;
  
  if (*in_RSI != 0) {
    pvVar2 = std::array<unsigned_int,_2UL>::operator[](&inverse_,(ulong)*in_RSI);
    if (*pvVar2 == 0) {
      vVar1 = _get_inverse(*in_RSI);
      pvVar2 = std::array<unsigned_int,_2UL>::operator[](&inverse_,(ulong)*in_RSI);
      *pvVar2 = vVar1;
    }
  }
  pvVar2 = std::array<unsigned_int,_2UL>::operator[](&inverse_,(ulong)*in_RSI);
  Zp_field_element<2u,unsigned_int,void>::Zp_field_element<unsigned_int,void>
            ((Zp_field_element<2u,unsigned_int,void> *)this,*pvVar2);
  return (Zp_field_element<2U,_unsigned_int,_void>)(Element_conflict)this;
}

Assistant:

Zp_field_element get_inverse() const {
    if (element_ != 0 && inverse_[element_] == 0) {  // initialize everything at instantiation instead?
      inverse_[element_] = _get_inverse(element_);
    }

    return Zp_field_element<characteristic>(inverse_[element_]);
  }